

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void tile_worker_hook_init
               (AV1Decoder *pbi,DecWorkerData *thread_data,TileBufferDec *tile_buffer,
               TileDataDec *tile_data,uint8_t allow_update_cdf)

{
  uint8_t uVar1;
  int row;
  ThreadData_conflict *pTVar2;
  uint8_t *buffer;
  size_t size;
  aom_reader *r;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  qm_val_t *(*__src) [19];
  qm_val_t *(*__dest) [19];
  aom_internal_error_info *info;
  ulong uVar8;
  bool bVar9;
  
  pTVar2 = thread_data->td;
  row = (tile_data->tile_info).tile_row;
  iVar6 = (tile_data->tile_info).tile_col;
  pTVar2->bit_reader = &tile_data->bit_reader;
  memset(&pTVar2->cb_buffer_base,0,0x30000);
  av1_tile_init(&(pTVar2->dcb).xd.tile,&pbi->common,row,iVar6);
  (pTVar2->dcb).xd.current_base_qindex = (pbi->common).quant_params.base_qindex;
  buffer = tile_buffer->data;
  size = tile_buffer->size;
  info = &thread_data->error_info;
  r = pTVar2->bit_reader;
  if ((ulong)((long)thread_data->data_end - (long)buffer) <= size - 1) {
    (pTVar2->dcb).xd.mi_row = (pTVar2->dcb).xd.tile.mi_row_start;
    aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile length");
  }
  iVar6 = aom_reader_init(r,buffer,size);
  if (iVar6 != 0) {
    (pTVar2->dcb).xd.mi_row = (pTVar2->dcb).xd.tile.mi_row_start;
    aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bool decoder %d",1);
  }
  r->allow_update_cdf = allow_update_cdf;
  uVar1 = ((pbi->common).seq_params)->monochrome;
  __dest = (pTVar2->dcb).xd.plane[0].seg_iqmatrix;
  uVar8 = 0;
  do {
    if (*(char *)((long)(__dest + -2) + 0x80) == '\0') {
      uVar3 = *(undefined8 *)(pbi->common).quant_params.y_dequant_QTX;
      uVar4 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 2);
      uVar5 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar5;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar3;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar4;
      __src = (pbi->common).quant_params.y_iqmatrix;
    }
    else if (uVar8 == 1) {
      uVar3 = *(undefined8 *)(pbi->common).quant_params.u_dequant_QTX;
      uVar4 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 2);
      uVar5 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar5;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar3;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar4;
      __src = (pbi->common).quant_params.u_iqmatrix;
    }
    else {
      uVar3 = *(undefined8 *)(pbi->common).quant_params.v_dequant_QTX;
      uVar4 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 2);
      uVar5 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar5;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar3;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar4;
      __src = (pbi->common).quant_params.v_iqmatrix;
    }
    memcpy(__dest,__src,0x4c0);
    if (uVar1 != '\0') break;
    __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
    bVar9 = uVar8 < 2;
    uVar8 = uVar8 + 1;
  } while (bVar9);
  (pTVar2->dcb).xd.mi_stride = (pbi->common).mi_params.mi_stride;
  (pTVar2->dcb).xd.error_info = (pbi->common).error;
  cfl_init(&(pTVar2->dcb).xd.cfl,(pbi->common).seq_params);
  (pTVar2->dcb).xd.error_info = info;
  uVar1 = ((pbi->common).seq_params)->monochrome;
  lVar7 = 0;
  do {
    (pTVar2->dcb).xd.above_entropy_context[lVar7] = (pbi->common).above_contexts.entropy[lVar7][row]
    ;
    lVar7 = lVar7 + 1;
  } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar7);
  (pTVar2->dcb).xd.above_partition_context = (pbi->common).above_contexts.partition[row];
  (pTVar2->dcb).xd.above_txfm_context = (pbi->common).above_contexts.txfm[row];
  memcpy(&tile_data->tctx,(pbi->common).fc,0x52fc);
  (pTVar2->dcb).xd.tile_ctx = &tile_data->tctx;
  return;
}

Assistant:

static inline void tile_worker_hook_init(AV1Decoder *const pbi,
                                         DecWorkerData *const thread_data,
                                         const TileBufferDec *const tile_buffer,
                                         TileDataDec *const tile_data,
                                         uint8_t allow_update_cdf) {
  AV1_COMMON *cm = &pbi->common;
  ThreadData *const td = thread_data->td;
  int tile_row = tile_data->tile_info.tile_row;
  int tile_col = tile_data->tile_info.tile_col;

  td->bit_reader = &tile_data->bit_reader;
  av1_zero(td->cb_buffer_base.dqcoeff);

  MACROBLOCKD *const xd = &td->dcb.xd;
  av1_tile_init(&xd->tile, cm, tile_row, tile_col);
  xd->current_base_qindex = cm->quant_params.base_qindex;

  setup_bool_decoder(xd, tile_buffer->data, thread_data->data_end,
                     tile_buffer->size, &thread_data->error_info,
                     td->bit_reader, allow_update_cdf);
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    td->bit_reader->accounting = &pbi->accounting;
    td->bit_reader->accounting->last_tell_frac =
        aom_reader_tell_frac(td->bit_reader);
  } else {
    td->bit_reader->accounting = NULL;
  }
#endif
  av1_init_macroblockd(cm, xd);
  xd->error_info = &thread_data->error_info;
  av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row, xd);

  // Initialise the tile context from the frame context
  tile_data->tctx = *cm->fc;
  xd->tile_ctx = &tile_data->tctx;
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    tile_data->bit_reader.accounting->last_tell_frac =
        aom_reader_tell_frac(&tile_data->bit_reader);
  }
#endif
}